

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  RayK<4> *pRVar30;
  ulong *puVar31;
  ulong unaff_RBP;
  size_t mask;
  undefined4 uVar32;
  ulong uVar33;
  undefined8 uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong *puVar39;
  ulong *puVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  float fVar45;
  uint uVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  uint uVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  uint uVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  vint4 bi;
  float fVar58;
  uint uVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  uint uVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  uint uVar68;
  uint uVar69;
  float fVar70;
  float fVar71;
  uint uVar72;
  uint uVar73;
  float fVar74;
  vint4 ai;
  float fVar75;
  uint uVar76;
  uint uVar77;
  float fVar78;
  uint uVar79;
  float fVar80;
  float fVar81;
  uint uVar83;
  uint uVar86;
  vint4 ai_1;
  float fVar84;
  float fVar85;
  float fVar87;
  float fVar88;
  uint uVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar82 [16];
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  NodeRef stack [244];
  int local_848;
  int iStack_844;
  int iStack_840;
  int iStack_83c;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar8 = (tray->tnear).field_0.i[k];
  iVar9 = (tray->tfar).field_0.i[k];
  puVar40 = local_7d0;
  do {
    puVar39 = puVar40;
    puVar31 = &local_7d8;
    if (puVar39 == puVar31) break;
    puVar40 = puVar39 + -1;
    uVar43 = puVar39[-1];
    do {
      if ((uVar43 & 8) == 0) {
        pfVar1 = (float *)(uVar43 + 0x20 + uVar37);
        fVar45 = (*pfVar1 - fVar2) * fVar5;
        fVar49 = (pfVar1[1] - fVar2) * fVar5;
        fVar53 = (pfVar1[2] - fVar2) * fVar5;
        fVar58 = (pfVar1[3] - fVar2) * fVar5;
        pfVar1 = (float *)(uVar43 + 0x20 + uVar35);
        fVar63 = (*pfVar1 - fVar3) * fVar6;
        fVar67 = (pfVar1[1] - fVar3) * fVar6;
        fVar71 = (pfVar1[2] - fVar3) * fVar6;
        fVar75 = (pfVar1[3] - fVar3) * fVar6;
        uVar64 = (uint)((int)fVar63 < (int)fVar45) * (int)fVar45 |
                 (uint)((int)fVar63 >= (int)fVar45) * (int)fVar63;
        uVar68 = (uint)((int)fVar67 < (int)fVar49) * (int)fVar49 |
                 (uint)((int)fVar67 >= (int)fVar49) * (int)fVar67;
        uVar72 = (uint)((int)fVar71 < (int)fVar53) * (int)fVar53 |
                 (uint)((int)fVar71 >= (int)fVar53) * (int)fVar71;
        uVar76 = (uint)((int)fVar75 < (int)fVar58) * (int)fVar58 |
                 (uint)((int)fVar75 >= (int)fVar58) * (int)fVar75;
        pfVar1 = (float *)(uVar43 + 0x20 + uVar36);
        fVar45 = (*pfVar1 - fVar4) * fVar7;
        fVar49 = (pfVar1[1] - fVar4) * fVar7;
        fVar53 = (pfVar1[2] - fVar4) * fVar7;
        fVar58 = (pfVar1[3] - fVar4) * fVar7;
        uVar46 = (uint)((int)fVar45 < iVar8) * iVar8 | (uint)((int)fVar45 >= iVar8) * (int)fVar45;
        uVar50 = (uint)((int)fVar49 < iVar8) * iVar8 | (uint)((int)fVar49 >= iVar8) * (int)fVar49;
        uVar54 = (uint)((int)fVar53 < iVar8) * iVar8 | (uint)((int)fVar53 >= iVar8) * (int)fVar53;
        uVar59 = (uint)((int)fVar58 < iVar8) * iVar8 | (uint)((int)fVar58 >= iVar8) * (int)fVar58;
        pfVar1 = (float *)(uVar43 + 0x20 + (uVar37 ^ 0x10));
        fVar45 = (*pfVar1 - fVar2) * fVar5;
        fVar49 = (pfVar1[1] - fVar2) * fVar5;
        fVar53 = (pfVar1[2] - fVar2) * fVar5;
        fVar58 = (pfVar1[3] - fVar2) * fVar5;
        pfVar1 = (float *)(uVar43 + 0x20 + (uVar35 ^ 0x10));
        fVar63 = (*pfVar1 - fVar3) * fVar6;
        fVar67 = (pfVar1[1] - fVar3) * fVar6;
        fVar71 = (pfVar1[2] - fVar3) * fVar6;
        fVar75 = (pfVar1[3] - fVar3) * fVar6;
        uVar79 = (uint)((int)fVar45 < (int)fVar63) * (int)fVar45 |
                 (uint)((int)fVar45 >= (int)fVar63) * (int)fVar63;
        uVar83 = (uint)((int)fVar49 < (int)fVar67) * (int)fVar49 |
                 (uint)((int)fVar49 >= (int)fVar67) * (int)fVar67;
        uVar86 = (uint)((int)fVar53 < (int)fVar71) * (int)fVar53 |
                 (uint)((int)fVar53 >= (int)fVar71) * (int)fVar71;
        uVar89 = (uint)((int)fVar58 < (int)fVar75) * (int)fVar58 |
                 (uint)((int)fVar58 >= (int)fVar75) * (int)fVar75;
        pfVar1 = (float *)(uVar43 + 0x20 + (uVar36 ^ 0x10));
        fVar45 = (*pfVar1 - fVar4) * fVar7;
        fVar49 = (pfVar1[1] - fVar4) * fVar7;
        fVar53 = (pfVar1[2] - fVar4) * fVar7;
        fVar58 = (pfVar1[3] - fVar4) * fVar7;
        uVar65 = (uint)(iVar9 < (int)fVar45) * iVar9 | (uint)(iVar9 >= (int)fVar45) * (int)fVar45;
        uVar69 = (uint)(iVar9 < (int)fVar49) * iVar9 | (uint)(iVar9 >= (int)fVar49) * (int)fVar49;
        uVar73 = (uint)(iVar9 < (int)fVar53) * iVar9 | (uint)(iVar9 >= (int)fVar53) * (int)fVar53;
        uVar77 = (uint)(iVar9 < (int)fVar58) * iVar9 | (uint)(iVar9 >= (int)fVar58) * (int)fVar58;
        auVar11._4_4_ =
             -(uint)((int)(((int)uVar83 < (int)uVar69) * uVar83 |
                          ((int)uVar83 >= (int)uVar69) * uVar69) <
                    (int)(((int)uVar50 < (int)uVar68) * uVar68 |
                         ((int)uVar50 >= (int)uVar68) * uVar50));
        auVar11._0_4_ =
             -(uint)((int)(((int)uVar79 < (int)uVar65) * uVar79 |
                          ((int)uVar79 >= (int)uVar65) * uVar65) <
                    (int)(((int)uVar46 < (int)uVar64) * uVar64 |
                         ((int)uVar46 >= (int)uVar64) * uVar46));
        auVar11._8_4_ =
             -(uint)((int)(((int)uVar86 < (int)uVar73) * uVar86 |
                          ((int)uVar86 >= (int)uVar73) * uVar73) <
                    (int)(((int)uVar54 < (int)uVar72) * uVar72 |
                         ((int)uVar54 >= (int)uVar72) * uVar54));
        auVar11._12_4_ =
             -(uint)((int)(((int)uVar89 < (int)uVar77) * uVar89 |
                          ((int)uVar89 >= (int)uVar77) * uVar77) <
                    (int)(((int)uVar59 < (int)uVar76) * uVar76 |
                         ((int)uVar59 >= (int)uVar76) * uVar59));
        uVar46 = movmskps((int)puVar31,auVar11);
        unaff_RBP = ((ulong)uVar46 ^ 0xf) & 0xff;
      }
      if ((uVar43 & 8) == 0) {
        if (unaff_RBP == 0) {
          puVar31 = (ulong *)0x4;
        }
        else {
          uVar42 = uVar43 & 0xfffffffffffffff0;
          lVar41 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
            }
          }
          puVar31 = (ulong *)0x0;
          uVar43 = *(ulong *)(uVar42 + lVar41 * 8);
          uVar38 = unaff_RBP - 1 & unaff_RBP;
          if (uVar38 != 0) {
            *puVar40 = uVar43;
            lVar41 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
              }
            }
            uVar33 = uVar38 - 1;
            while( true ) {
              puVar40 = puVar40 + 1;
              uVar43 = *(ulong *)(uVar42 + lVar41 * 8);
              uVar33 = uVar33 & uVar38;
              if (uVar33 == 0) break;
              *puVar40 = uVar43;
              lVar41 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                }
              }
              uVar38 = uVar33 - 1;
            }
          }
        }
      }
      else {
        puVar31 = (ulong *)0x6;
      }
    } while ((int)puVar31 == 0);
    if ((int)puVar31 == 6) {
      uVar42 = (ulong)((uint)uVar43 & 0xf) - 8;
      bVar44 = uVar42 != 0;
      if (bVar44) {
        uVar43 = uVar43 & 0xfffffffffffffff0;
        fVar45 = *(float *)(ray + k * 4);
        fVar49 = *(float *)(ray + k * 4 + 0x10);
        fVar53 = *(float *)(ray + k * 4 + 0x20);
        fVar58 = *(float *)(ray + k * 4 + 0x40);
        fVar63 = *(float *)(ray + k * 4 + 0x50);
        fVar67 = *(float *)(ray + k * 4 + 0x60);
        uVar38 = 0;
        pRVar30 = ray;
        do {
          lVar41 = uVar38 * 0xb0;
          pfVar1 = (float *)(uVar43 + 0x80 + lVar41);
          fVar71 = *pfVar1;
          fVar75 = pfVar1[1];
          fVar57 = pfVar1[2];
          fVar62 = pfVar1[3];
          pfVar1 = (float *)(uVar43 + 0x40 + lVar41);
          fVar101 = *pfVar1;
          fVar103 = pfVar1[1];
          fVar105 = pfVar1[2];
          fVar107 = pfVar1[3];
          pfVar1 = (float *)(uVar43 + 0x70 + lVar41);
          fVar81 = *pfVar1;
          fVar85 = pfVar1[1];
          fVar88 = pfVar1[2];
          fVar91 = pfVar1[3];
          pfVar1 = (float *)(uVar43 + 0x50 + lVar41);
          fVar17 = *pfVar1;
          fVar18 = pfVar1[1];
          fVar19 = pfVar1[2];
          fVar20 = pfVar1[3];
          fVar66 = fVar81 * fVar17 - fVar71 * fVar101;
          fVar70 = fVar85 * fVar18 - fVar75 * fVar103;
          fVar74 = fVar88 * fVar19 - fVar57 * fVar105;
          fVar78 = fVar91 * fVar20 - fVar62 * fVar107;
          pfVar1 = (float *)(uVar43 + 0x60 + lVar41);
          fVar21 = *pfVar1;
          fVar22 = pfVar1[1];
          fVar23 = pfVar1[2];
          fVar24 = pfVar1[3];
          pfVar1 = (float *)(uVar43 + lVar41);
          fVar108 = *pfVar1 - fVar45;
          fVar111 = pfVar1[1] - fVar45;
          fVar114 = pfVar1[2] - fVar45;
          fVar117 = pfVar1[3] - fVar45;
          pfVar1 = (float *)(uVar43 + 0x10 + lVar41);
          fVar47 = *pfVar1 - fVar49;
          fVar51 = pfVar1[1] - fVar49;
          fVar55 = pfVar1[2] - fVar49;
          fVar60 = pfVar1[3] - fVar49;
          fVar100 = fVar63 * fVar108 - fVar58 * fVar47;
          fVar102 = fVar63 * fVar111 - fVar58 * fVar51;
          fVar104 = fVar63 * fVar114 - fVar58 * fVar55;
          fVar106 = fVar63 * fVar117 - fVar58 * fVar60;
          pfVar1 = (float *)(uVar43 + 0x20 + lVar41);
          fVar120 = *pfVar1 - fVar53;
          fVar121 = pfVar1[1] - fVar53;
          fVar122 = pfVar1[2] - fVar53;
          fVar123 = pfVar1[3] - fVar53;
          pfVar1 = (float *)(uVar43 + 0x30 + lVar41);
          fVar25 = *pfVar1;
          fVar26 = pfVar1[1];
          fVar27 = pfVar1[2];
          fVar28 = pfVar1[3];
          fVar80 = fVar71 * fVar25 - fVar17 * fVar21;
          fVar84 = fVar75 * fVar26 - fVar18 * fVar22;
          fVar87 = fVar57 * fVar27 - fVar19 * fVar23;
          fVar90 = fVar62 * fVar28 - fVar20 * fVar24;
          fVar96 = fVar58 * fVar120 - fVar108 * fVar67;
          fVar97 = fVar58 * fVar121 - fVar111 * fVar67;
          fVar98 = fVar58 * fVar122 - fVar114 * fVar67;
          fVar99 = fVar58 * fVar123 - fVar117 * fVar67;
          fVar109 = fVar101 * fVar21 - fVar81 * fVar25;
          fVar112 = fVar103 * fVar22 - fVar85 * fVar26;
          fVar115 = fVar105 * fVar23 - fVar88 * fVar27;
          fVar118 = fVar107 * fVar24 - fVar91 * fVar28;
          fVar48 = fVar67 * fVar47 - fVar63 * fVar120;
          fVar52 = fVar67 * fVar51 - fVar63 * fVar121;
          fVar56 = fVar67 * fVar55 - fVar63 * fVar122;
          fVar61 = fVar67 * fVar60 - fVar63 * fVar123;
          fVar110 = fVar66 * fVar58 + fVar80 * fVar63 + fVar109 * fVar67;
          fVar113 = fVar70 * fVar58 + fVar84 * fVar63 + fVar112 * fVar67;
          fVar116 = fVar74 * fVar58 + fVar87 * fVar63 + fVar115 * fVar67;
          fVar119 = fVar78 * fVar58 + fVar90 * fVar63 + fVar118 * fVar67;
          uVar50 = (uint)fVar110 & 0x80000000;
          uVar54 = (uint)fVar113 & 0x80000000;
          uVar59 = (uint)fVar116 & 0x80000000;
          uVar64 = (uint)fVar119 & 0x80000000;
          fVar81 = (float)((uint)(fVar21 * fVar48 + fVar81 * fVar96 + fVar71 * fVar100) ^ uVar50);
          fVar85 = (float)((uint)(fVar22 * fVar52 + fVar85 * fVar97 + fVar75 * fVar102) ^ uVar54);
          fVar88 = (float)((uint)(fVar23 * fVar56 + fVar88 * fVar98 + fVar57 * fVar104) ^ uVar59);
          fVar91 = (float)((uint)(fVar24 * fVar61 + fVar91 * fVar99 + fVar62 * fVar106) ^ uVar64);
          fVar71 = (float)((uint)(fVar48 * fVar25 + fVar96 * fVar101 + fVar100 * fVar17) ^ uVar50);
          fVar75 = (float)((uint)(fVar52 * fVar26 + fVar97 * fVar103 + fVar102 * fVar18) ^ uVar54);
          fVar57 = (float)((uint)(fVar56 * fVar27 + fVar98 * fVar105 + fVar104 * fVar19) ^ uVar59);
          fVar62 = (float)((uint)(fVar61 * fVar28 + fVar99 * fVar107 + fVar106 * fVar20) ^ uVar64);
          fVar101 = ABS(fVar110);
          fVar103 = ABS(fVar113);
          fVar105 = ABS(fVar116);
          fVar107 = ABS(fVar119);
          bVar14 = ((0.0 <= fVar71 && 0.0 <= fVar81) && fVar110 != 0.0) &&
                   fVar81 + fVar71 <= fVar101;
          auVar82._0_4_ = -(uint)bVar14;
          bVar15 = ((0.0 <= fVar75 && 0.0 <= fVar85) && fVar113 != 0.0) &&
                   fVar85 + fVar75 <= fVar103;
          auVar82._4_4_ = -(uint)bVar15;
          bVar16 = ((0.0 <= fVar57 && 0.0 <= fVar88) && fVar116 != 0.0) &&
                   fVar88 + fVar57 <= fVar105;
          auVar82._8_4_ = -(uint)bVar16;
          bVar13 = ((0.0 <= fVar62 && 0.0 <= fVar91) && fVar119 != 0.0) &&
                   fVar91 + fVar62 <= fVar107;
          auVar82._12_4_ = -(uint)bVar13;
          uVar46 = movmskps((int)pRVar30,auVar82);
          pRVar30 = (RayK<4> *)(ulong)uVar46;
          if (uVar46 == 0) {
            uVar34 = 0;
          }
          else {
            fVar57 = (float)(uVar50 ^ (uint)(fVar66 * fVar108 + fVar80 * fVar47 + fVar109 * fVar120)
                            );
            fVar62 = (float)(uVar54 ^ (uint)(fVar70 * fVar111 + fVar84 * fVar51 + fVar112 * fVar121)
                            );
            fVar81 = (float)(uVar59 ^ (uint)(fVar74 * fVar114 + fVar87 * fVar55 + fVar115 * fVar122)
                            );
            fVar85 = (float)(uVar64 ^ (uint)(fVar78 * fVar117 + fVar90 * fVar60 + fVar118 * fVar123)
                            );
            fVar71 = *(float *)(ray + k * 4 + 0x30);
            fVar75 = *(float *)(ray + k * 4 + 0x80);
            iVar92 = -(uint)((fVar57 <= fVar75 * fVar101 && fVar71 * fVar101 < fVar57) && bVar14);
            iVar93 = -(uint)((fVar62 <= fVar75 * fVar103 && fVar71 * fVar103 < fVar62) && bVar15);
            iVar94 = -(uint)((fVar81 <= fVar75 * fVar105 && fVar71 * fVar105 < fVar81) && bVar16);
            iVar95 = -(uint)((fVar85 <= fVar75 * fVar107 && fVar71 * fVar107 < fVar85) && bVar13);
            auVar12._4_4_ = iVar93;
            auVar12._0_4_ = iVar92;
            auVar12._8_4_ = iVar94;
            auVar12._12_4_ = iVar95;
            uVar46 = movmskps((int)ray,auVar12);
            pRVar30 = (RayK<4> *)(ulong)uVar46;
            uVar34 = CONCAT71((int7)(uVar42 >> 8),uVar46 != 0);
            if (uVar46 != 0) {
              local_848 = iVar92;
              iStack_844 = iVar93;
              iStack_840 = iVar94;
              iStack_83c = iVar95;
            }
          }
          if ((char)uVar34 != '\0') {
            auVar29._4_4_ = iStack_844;
            auVar29._0_4_ = local_848;
            auVar29._8_4_ = iStack_840;
            auVar29._12_4_ = iStack_83c;
            uVar32 = movmskps((int)uVar34,auVar29);
            uVar33 = CONCAT44((int)((ulong)uVar34 >> 0x20),uVar32);
            do {
              uVar10 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar46 = *(uint *)(ray + k * 4 + 0x90) &
                       ((context->scene->geometries).items
                        [*(uint *)(lVar41 + uVar43 + 0x90 + uVar10 * 4)].ptr)->mask;
              pRVar30 = (RayK<4> *)(ulong)uVar46;
              if (uVar46 != 0) goto LAB_00266ca6;
              uVar33 = uVar33 ^ 1L << (uVar10 & 0x3f);
            } while (uVar33 != 0);
          }
          uVar38 = uVar38 + 1;
          bVar44 = uVar38 < uVar42;
        } while (uVar38 != uVar42);
      }
LAB_00266ca6:
      puVar31 = (ulong *)0x0;
      if (bVar44) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        puVar31 = (ulong *)0x1;
      }
    }
  } while (((ulong)puVar31 & 3) == 0);
  return puVar39 != &local_7d8;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }